

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsEndpointSendStringAt
               (HelicsEndpoint endpoint,char *message,HelicsTime time,HelicsError *err)

{
  Endpoint *this;
  undefined8 *puVar1;
  size_t data_size;
  Time sendTime;
  _Alloc_hider data;
  bool bVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (endpoint == (HelicsEndpoint)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001adfc4;
    }
    else {
      bVar2 = *(int *)((long)endpoint + 0x20) == -0x4bac6b3e;
      puVar1 = (undefined8 *)0x0;
      if (bVar2) {
        puVar1 = (undefined8 *)endpoint;
      }
      if (bVar2 || err == (HelicsError *)0x0) goto LAB_001adfc6;
    }
    err->error_code = -3;
    err->message = "The given endpoint does not point to a valid object";
  }
LAB_001adfc4:
  puVar1 = (undefined8 *)0x0;
LAB_001adfc6:
  if (puVar1 != (undefined8 *)0x0) {
    this = (Endpoint *)*puVar1;
    data_size = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    data._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (message != (char *)0x0) {
      data_size = strlen(message);
      data._M_p = message;
    }
    sendTime.internalTimeCode = 0x7fffffffffffffff;
    if (time <= -9223372036.854765) {
      sendTime.internalTimeCode = -0x7fffffffffffffff;
    }
    else if (time < 9223372036.854765) {
      sendTime.internalTimeCode =
           (baseType)
           (time * 1000000000.0 +
           *(double *)(&DAT_00436020 + (ulong)(0.0 <= time * 1000000000.0) * 8));
    }
    helics::Endpoint::sendAt(this,data._M_p,data_size,sendTime);
  }
  return;
}

Assistant:

void helicsEndpointSendStringAt(HelicsEndpoint endpoint, const char* message, HelicsTime time, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->sendAt(AS_STRING_VIEW(message), time);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}